

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

shared_ptr<CLI::ConfigBase> __thiscall CLI::App::get_config_formatter_base(App *this)

{
  element_type *in_RDI;
  shared_ptr<CLI::ConfigBase> sVar1;
  
  sVar1 = ::std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)this);
  sVar1.super___shared_ptr<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<CLI::ConfigBase>)
         sVar1.super___shared_ptr<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CLI11_NODISCARD std::shared_ptr<ConfigBase> get_config_formatter_base() const {
        // This is safer as a dynamic_cast if we have RTTI, as Config -> ConfigBase
#if CLI11_USE_STATIC_RTTI == 0
        return std::dynamic_pointer_cast<ConfigBase>(config_formatter_);
#else
        return std::static_pointer_cast<ConfigBase>(config_formatter_);
#endif
    }